

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llist.c
# Opt level: O0

void Curl_node_uremove(Curl_llist_node *e,void *user)

{
  Curl_llist *pCVar1;
  void *pvVar2;
  Curl_llist *list;
  void *ptr;
  void *user_local;
  Curl_llist_node *e_local;
  
  if (e != (Curl_llist_node *)0x0) {
    pCVar1 = e->_list;
    if (e == pCVar1->_head) {
      pCVar1->_head = e->_next;
      if (pCVar1->_head == (Curl_llist_node *)0x0) {
        pCVar1->_tail = (Curl_llist_node *)0x0;
      }
      else {
        e->_next->_prev = (Curl_llist_node *)0x0;
      }
    }
    else {
      if (e->_prev != (Curl_llist_node *)0x0) {
        e->_prev->_next = e->_next;
      }
      if (e->_next == (Curl_llist_node *)0x0) {
        pCVar1->_tail = e->_prev;
      }
      else {
        e->_next->_prev = e->_prev;
      }
    }
    pvVar2 = e->_ptr;
    e->_list = (Curl_llist *)0x0;
    e->_ptr = (void *)0x0;
    e->_prev = (Curl_llist_node *)0x0;
    e->_next = (Curl_llist_node *)0x0;
    pCVar1->_size = pCVar1->_size - 1;
    if (pCVar1->_dtor != (Curl_llist_dtor)0x0) {
      (*pCVar1->_dtor)(user,pvVar2);
    }
  }
  return;
}

Assistant:

void
Curl_node_uremove(struct Curl_llist_node *e, void *user)
{
  void *ptr;
  struct Curl_llist *list;
  if(!e)
    return;

  list = e->_list;
  DEBUGASSERT(list);
  DEBUGASSERT(list->_init == LLISTINIT);
  DEBUGASSERT(list->_size);
  DEBUGASSERT(e->_init == NODEINIT);
  if(e == list->_head) {
    list->_head = e->_next;

    if(!list->_head)
      list->_tail = NULL;
    else
      e->_next->_prev = NULL;
  }
  else {
    if(e->_prev)
      e->_prev->_next = e->_next;

    if(!e->_next)
      list->_tail = e->_prev;
    else
      e->_next->_prev = e->_prev;
  }

  ptr = e->_ptr;

  e->_list = NULL;
  e->_ptr  = NULL;
  e->_prev = NULL;
  e->_next = NULL;
#ifdef DEBUGBUILD
  e->_init = NODEREM; /* specific pattern on remove - not zero */
#endif

  --list->_size;

  /* call the dtor() last for when it actually frees the 'e' memory itself */
  if(list->_dtor)
    list->_dtor(user, ptr);
}